

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavInitRequestApplyResult(void)

{
  ImGuiNavLayer unaff_retaddr;
  ImGuiID unaff_retaddr_00;
  ImGuiNavItemData *result;
  ImGuiContext *g;
  ImRect *rect_rel;
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow != (ImGuiWindow *)0x0) {
    rect_rel = (ImRect *)&GImGui->NavInitResult;
    if (GImGui->NavId != (GImGui->NavInitResult).ID) {
      GImGui->NavJustMovedFromFocusScopeId = GImGui->NavFocusScopeId;
      pIVar1->NavJustMovedToId = (pIVar1->NavInitResult).ID;
      pIVar1->NavJustMovedToFocusScopeId = (pIVar1->NavInitResult).FocusScopeId;
      pIVar1->NavJustMovedToKeyMods = 0;
      pIVar1->NavJustMovedToIsTabbing = false;
      pIVar1->NavJustMovedToHasSelectionData = ((pIVar1->NavInitResult).InFlags & 0x200000U) != 0;
    }
    if ((pIVar1->DebugLogFlags & 8U) != 0) {
      DebugLog("[nav] NavInitRequest: ApplyResult: NavID 0x%08X in Layer %d Window \"%s\"\n",
               (ulong)(pIVar1->NavInitResult).ID,(ulong)pIVar1->NavLayer,pIVar1->NavWindow->Name);
    }
    SetNavID(unaff_retaddr_00,unaff_retaddr,(ImGuiID)((ulong)pIVar1 >> 0x20),rect_rel);
    pIVar1->NavIdIsAlive = true;
    if (rect_rel[3].Min != (ImVec2)0xffffffffffffffff) {
      pIVar1->NavLastValidSelectionUserData = (ImGuiSelectionUserData)rect_rel[3].Min;
    }
    if ((pIVar1->NavInitRequestFromMove & 1U) != 0) {
      NavRestoreHighlightAfterMove();
    }
  }
  return;
}

Assistant:

void ImGui::NavInitRequestApplyResult()
{
    // In very rare cases g.NavWindow may be null (e.g. clearing focus after requesting an init request, which does happen when releasing Alt while clicking on void)
    ImGuiContext& g = *GImGui;
    if (!g.NavWindow)
        return;

    ImGuiNavItemData* result = &g.NavInitResult;
    if (g.NavId != result->ID)
    {
        g.NavJustMovedFromFocusScopeId = g.NavFocusScopeId;
        g.NavJustMovedToId = result->ID;
        g.NavJustMovedToFocusScopeId = result->FocusScopeId;
        g.NavJustMovedToKeyMods = 0;
        g.NavJustMovedToIsTabbing = false;
        g.NavJustMovedToHasSelectionData = (result->InFlags & ImGuiItemFlags_HasSelectionUserData) != 0;
    }

    // Apply result from previous navigation init request (will typically select the first item, unless SetItemDefaultFocus() has been called)
    // FIXME-NAV: On _NavFlattened windows, g.NavWindow will only be updated during subsequent frame. Not a problem currently.
    IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: ApplyResult: NavID 0x%08X in Layer %d Window \"%s\"\n", result->ID, g.NavLayer, g.NavWindow->Name);
    SetNavID(result->ID, g.NavLayer, result->FocusScopeId, result->RectRel);
    g.NavIdIsAlive = true; // Mark as alive from previous frame as we got a result
    if (result->SelectionUserData != ImGuiSelectionUserData_Invalid)
        g.NavLastValidSelectionUserData = result->SelectionUserData;
    if (g.NavInitRequestFromMove)
        NavRestoreHighlightAfterMove();
}